

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O1

XSAnnotation * __thiscall
xercesc_4_0::XSObjectFactory::getAnnotationFromModel
          (XSObjectFactory *this,XSModel *xsModel,void *key)

{
  BaseRefVectorOf<xercesc_4_0::XSNamespaceItem> *this_00;
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *pRVar1;
  bool bVar2;
  XSNamespaceItem *pXVar3;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar4;
  XSAnnotation *pXVar5;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar6;
  XMLSize_t getAt;
  XSAnnotation *unaff_R15;
  bool bVar7;
  
  do {
    this_00 = &xsModel->fXSNamespaceItemList->super_BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>;
    bVar7 = this_00->fCurCount != 0;
    if (bVar7) {
      getAt = 0;
      do {
        pXVar3 = BaseRefVectorOf<xercesc_4_0::XSNamespaceItem>::elementAt(this_00,getAt);
        if (pXVar3->fGrammar == (SchemaGrammar *)0x0) {
LAB_002cf121:
          bVar2 = true;
        }
        else {
          pRVar1 = pXVar3->fGrammar->fAnnotations;
          pRVar4 = pRVar1->fBucketList[(ulong)key % pRVar1->fHashModulus];
          pRVar6 = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
          if (pRVar4 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) {
            do {
              pRVar6 = pRVar4;
              if (pRVar4->fKey == key) goto LAB_002cf109;
              pRVar4 = pRVar4->fNext;
            } while (pRVar4 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0);
            pRVar6 = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
          }
LAB_002cf109:
          if (pRVar6 == (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) {
            pXVar5 = (XSAnnotation *)0x0;
          }
          else {
            pXVar5 = pRVar6->fData;
          }
          if (pXVar5 == (XSAnnotation *)0x0) goto LAB_002cf121;
          bVar2 = false;
          unaff_R15 = pXVar5;
        }
        if (!bVar2) break;
        getAt = (XMLSize_t)((int)getAt + 1);
        bVar7 = getAt < this_00->fCurCount;
      } while (getAt < this_00->fCurCount);
    }
    if (bVar7) {
      return unaff_R15;
    }
    xsModel = xsModel->fParent;
    if (xsModel == (XSModel *)0x0) {
      return (XSAnnotation *)0x0;
    }
  } while( true );
}

Assistant:

XSAnnotation* XSObjectFactory::getAnnotationFromModel(XSModel* const xsModel,
                                               const void* const key)
{
    XSNamespaceItemList* namespaceItemList = xsModel->getNamespaceItems();

    XSAnnotation* annot = 0;
    for (unsigned int i=0; i<namespaceItemList->size(); i++)
    {
        XSNamespaceItem* nsItem = namespaceItemList->elementAt(i);
        if (nsItem->fGrammar)
        {
            annot = nsItem->fGrammar->getAnnotation(key);
            if (annot)
                return annot;
        }
    }

    if (xsModel->fParent)
        return getAnnotationFromModel(xsModel->fParent, key);
    return 0;
}